

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingTest::init(VaryingTest *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VertexVaryingShader *pVVar2;
  VaryingTest *this_00;
  int iVar3;
  ShaderProgramDeclaration *pSVar4;
  ostream *poVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  int vertexNdx;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  ostringstream vertexSource;
  ostringstream geometrySource;
  ostringstream fragmentSource;
  ContextType local_6f4;
  ulong local_6f0;
  VertexAttribute local_6e8;
  FragmentSource local_6c0;
  string local_6a0;
  VertexAttribute local_680;
  VertexVaryingShader *local_658;
  VaryingTest *local_650;
  string local_648;
  GeometrySource local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  ShaderProgramDeclaration local_5a8;
  undefined1 local_498 [376];
  undefined1 local_320 [376];
  undefined1 local_1a8 [376];
  
  local_658 = (VertexVaryingShader *)operator_new(0x160);
  local_6f4.super_ApiType.m_bits =
       (ApiType)(*((this->super_GeometryShaderRenderTest).super_TestCase.m_context)->m_renderCtx->
                  _vptr_RenderContext[2])();
  iVar3 = this->m_vertexOut;
  uVar10 = this->m_geometryOut;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_5a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  local_6a0.field_2._M_allocated_capacity = 0x697469736f705f61;
  local_6a0.field_2._8_2_ = 0x6e6f;
  local_6a0._M_string_length = 10;
  local_6a0.field_2._M_local_buf[10] = '\0';
  local_6e8.name._M_dataplus._M_p = (pointer)&local_6e8.name.field_2;
  local_6e8.name.field_2._M_allocated_capacity = 0x697469736f705f61;
  local_6e8.name.field_2._8_2_ = 0x6e6f;
  local_6e8.name._M_string_length = 10;
  local_6e8.name.field_2._M_local_buf[10] = '\0';
  local_6e8.type = GENERICVECTYPE_FLOAT;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_5a8,&local_6e8);
  local_6c0.source._M_dataplus._M_p = (pointer)&local_6c0.source.field_2;
  local_6c0.source.field_2._M_allocated_capacity._0_4_ = 0x6f635f61;
  local_6c0.source._M_string_length = 7;
  local_6c0.source.field_2._M_allocated_capacity._4_4_ = 0x726f6c;
  paVar1 = &local_680.name.field_2;
  local_680.name.field_2._M_allocated_capacity._0_4_ = 0x6f635f61;
  local_680.name._M_string_length = 7;
  local_680.name.field_2._M_allocated_capacity._4_4_ = 0x726f6c;
  local_680.type = GENERICVECTYPE_FLOAT;
  local_680.name._M_dataplus._M_p = (pointer)paVar1;
  sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_680);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_680.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_680.name._M_dataplus._M_p,
                    CONCAT44(local_680.name.field_2._M_allocated_capacity._4_4_,
                             local_680.name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0.source._M_dataplus._M_p != &local_6c0.source.field_2) {
    operator_delete(local_6c0.source._M_dataplus._M_p,
                    CONCAT44(local_6c0.source.field_2._M_allocated_capacity._4_4_,
                             local_6c0.source.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_6f0 = (ulong)uVar10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8.name._M_dataplus._M_p != &local_6e8.name.field_2) {
    operator_delete(local_6e8.name._M_dataplus._M_p,local_6e8.name.field_2._M_allocated_capacity + 1
                   );
  }
  local_650 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if (0 < iVar3) {
    iVar9 = iVar3;
    do {
      local_6e8.name._M_dataplus._M_p = local_6e8.name._M_dataplus._M_p & 0xffffff0000000000;
      sglr::pdec::ShaderProgramDeclaration::operator<<
                (&local_5a8,(VertexToGeometryVarying *)&local_6e8);
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  if (0 < (int)local_6f0) {
    uVar11 = local_6f0 & 0xffffffff;
    do {
      local_6e8.name._M_dataplus._M_p = local_6e8.name._M_dataplus._M_p & 0xffffff0000000000;
      sglr::pdec::ShaderProgramDeclaration::operator<<
                (&local_5a8,(GeometryToFragmentVarying *)&local_6e8);
      uVar10 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 != 0);
  }
  local_680.name._M_dataplus._M_p = local_680.name._M_dataplus._M_p & 0xffffffff00000000;
  pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_5a8,(FragmentOutput *)&local_680)
  ;
  local_6e8.name._M_dataplus._M_p = (pointer)0x200000003;
  local_6e8.name._M_string_length = 3;
  local_6e8.name.field_2._M_allocated_capacity = 1;
  sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,(GeometryShaderDeclaration *)&local_6e8);
  uVar11 = local_6f0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_498,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\n",0x46);
  if (iVar3 == -1) {
    lVar8 = 0x15;
    pcVar13 = "void main (void)\n{\n}\n";
  }
  else {
    if (0 < iVar3) {
      iVar9 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_498,"out highp vec4 v_geom_",0x16);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_498,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
        iVar9 = iVar9 + 1;
      } while (iVar3 != iVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_498,
               "void main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n",0x43);
    lVar8 = 2;
    pcVar13 = "}\n";
    if (iVar3 == 1) {
      lVar6 = 0x15;
      pcVar12 = "\tv_geom_0 = a_color;\n";
    }
    else {
      if (iVar3 != 2) goto LAB_01406bda;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_498,"\tv_geom_0 = a_color * 0.5;\n",0x1b);
      lVar6 = 0x20;
      pcVar12 = "\tv_geom_1 = a_color.zyxw * 0.5;\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar12,lVar6);
  }
LAB_01406bda:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,pcVar13,lVar8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\n",0x46);
  uVar10 = (uint)uVar11;
  if (0 < (int)uVar10) {
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"in mediump vec4 v_frag_",0x17);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
      uVar7 = uVar7 + 1;
    } while (uVar10 != uVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"void main (void)\n{\n",0x13);
  if (uVar10 < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,&DAT_01c73690 + *(int *)(&DAT_01c73690 + uVar11 * 4),
               *(long *)(&DAT_01c736a0 + uVar11 * 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout(triangles) in;\nlayout(triangle_strip, max_vertices = 3) out;\n"
             ,0x74);
  if (0 < iVar3) {
    iVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"in highp vec4 v_geom_",0x15);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_320,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[];\n",4);
      iVar9 = iVar9 + 1;
    } while (iVar3 != iVar9);
  }
  if (0 < (int)uVar10) {
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"out highp vec4 v_frag_",0x16);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_320,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";\n",2);
      uVar7 = uVar7 + 1;
    } while (uVar10 != uVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,
             "void main (void)\n{\n\thighp vec4 offset = vec4(-0.2, -0.2, 0.0, 0.0);\n\thighp vec4 inputColor;\n\n"
             ,0x5d);
  iVar9 = 0;
  do {
    if (iVar3 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,
                 "\tinputColor = vec4(1.0, 0.0, 0.0, 1.0);\n\tgl_Position = vec4(",0x3c);
      pcVar13 = "1.0, 1.0";
      if (iVar9 == 1) {
        pcVar13 = "1.0, 0.0";
      }
      if (iVar9 == 0) {
        pcVar13 = "0.0, 0.0";
      }
      lVar8 = 0x3a;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar13,8);
      pcVar13 = ", 0.0, 1.0) + offset;\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n";
      poVar5 = (ostream *)local_320;
    }
    else {
      if (iVar3 == 0) {
        lVar8 = 0x28;
        pcVar13 = "\tinputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";
        poVar5 = (ostream *)local_320;
LAB_01406e93:
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar13,lVar8);
      }
      else {
        if (iVar3 == 2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"\tinputColor = v_geom_0[",0x17);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_320,iVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] * 0.5 + v_geom_1[",0x13);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
          lVar8 = 0xe;
          pcVar13 = "].zyxw * 0.5;\n";
          goto LAB_01406e93;
        }
        if (iVar3 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_320,"\tinputColor = v_geom_0[",0x17);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_320,iVar9);
          lVar8 = 3;
          pcVar13 = "];\n";
          goto LAB_01406e93;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"\tgl_Position = gl_in[",0x15);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_320,iVar9);
      lVar8 = 0x3c;
      pcVar13 = "].gl_Position + offset;\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar13,lVar8);
    if ((int)local_6f0 == 1) {
      lVar8 = 0x18;
      pcVar13 = "\tv_frag_0 = inputColor;\n";
LAB_01406f09:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar13,lVar8);
    }
    else if ((int)local_6f0 == 2) {
      lVar8 = 0x23;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"\tv_frag_0 = inputColor * 0.5;\n",0x1e);
      pcVar13 = "\tv_frag_1 = inputColor.yxzw * 0.5;\n";
      goto LAB_01406f09;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tEmitVertex();\n\n",0x10);
    iVar9 = iVar9 + 1;
    if (iVar9 == 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"\tEndPrimitive();\n}\n",0x13);
      uVar11 = local_6f0;
      std::__cxx11::stringbuf::str();
      specializeShader(&local_680.name,&local_6a0,&local_6f4);
      local_6e8.name._M_dataplus._M_p = (pointer)&local_6e8.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6e8,local_680.name._M_dataplus._M_p,
                 local_680.name._M_dataplus._M_p + local_680.name._M_string_length);
      pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<
                         (&local_5a8,(VertexSource *)&local_6e8);
      std::__cxx11::stringbuf::str();
      specializeShader(&local_608,&local_5c8,&local_6f4);
      local_6c0.source._M_dataplus._M_p = (pointer)&local_6c0.source.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6c0,local_608._M_dataplus._M_p,
                 local_608._M_dataplus._M_p + local_608._M_string_length);
      pSVar4 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_6c0);
      std::__cxx11::stringbuf::str();
      specializeShader(&local_648,&local_5e8,&local_6f4);
      paVar1 = &local_628.source.field_2;
      local_628.source._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_628,local_648._M_dataplus._M_p,
                 local_648._M_dataplus._M_p + local_648._M_string_length);
      sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar4,&local_628);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628.source._M_dataplus._M_p != paVar1) {
        operator_delete(local_628.source._M_dataplus._M_p,
                        local_628.source.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_648._M_dataplus._M_p != &local_648.field_2) {
        operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
        operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c0.source._M_dataplus._M_p != &local_6c0.source.field_2) {
        operator_delete(local_6c0.source._M_dataplus._M_p,
                        CONCAT44(local_6c0.source.field_2._M_allocated_capacity._4_4_,
                                 local_6c0.source.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_dataplus._M_p != &local_608.field_2) {
        operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
        operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6e8.name._M_dataplus._M_p != &local_6e8.name.field_2) {
        operator_delete(local_6e8.name._M_dataplus._M_p,
                        local_6e8.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_680.name._M_dataplus._M_p != &local_680.name.field_2) {
        operator_delete(local_680.name._M_dataplus._M_p,
                        CONCAT44(local_680.name.field_2._M_allocated_capacity._4_4_,
                                 local_680.name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      this_00 = local_650;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
        operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
      std::ios_base::~ios_base((ios_base *)(local_498 + 0x70));
      pVVar2 = local_658;
      pSVar4 = &local_5a8;
      sglr::ShaderProgram::ShaderProgram(&local_658->super_ShaderProgram,pSVar4);
      sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_5a8);
      (pVVar2->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
           (_func_int **)&PTR_shadeVertices_0219b000;
      (pVVar2->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
           (_func_int **)&DAT_0219b038;
      (pVVar2->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
           (_func_int **)&DAT_0219b050;
      *(int *)&(pVVar2->super_ShaderProgram).field_0x154 = iVar3;
      pVVar2->m_geometryOut = (int)uVar11;
      this_00->m_program = pVVar2;
      iVar3 = GeometryShaderRenderTest::init
                        (&this_00->super_GeometryShaderRenderTest,(EVP_PKEY_CTX *)pSVar4);
      return iVar3;
    }
  } while( true );
}

Assistant:

void VaryingTest::init (void)
{
	m_program = new VertexVaryingShader(m_context.getRenderContext().getType(), m_vertexOut, m_geometryOut);

	GeometryShaderRenderTest::init();
}